

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.h
# Opt level: O1

vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
* __thiscall
data_structures::RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::getAllNodes
          (vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
           *__return_storage_ptr__,
          RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *this)

{
  pointer ppRVar1;
  undefined8 uVar2;
  function<void_(data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*)>
  fun;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  anon_class_16_2_633b7cac local_30;
  
  local_30.fun = (function<void_(data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*)>
                  *)&local_58;
  ppRVar1 = (this->_all_nodes).
            super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_all_nodes).
      super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppRVar1) {
    (this->_all_nodes).
    super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppRVar1;
  }
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_30.this = this;
  std::
  function<void(data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*)>
  ::operator=((function<void(data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*)>
               *)local_58._M_pod_data,&local_30);
  local_30.this = (RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *)this->_root;
  if (local_48 != (code *)0x0) {
    (*pcStack_40)(&local_58,
                  (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                   **)&local_30);
    std::
    vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
    ::vector(__return_storage_ptr__,&this->_all_nodes);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    return __return_storage_ptr__;
  }
  uVar2 = std::__throw_bad_function_call();
  __clang_call_terminate(uVar2);
}

Assistant:

inline
    std::vector<RBTreeNode<TreeElement<Key, Value>>*> RBTree<Key, Value>::getAllNodes(){
        _all_nodes.clear();
        std::function<void(RBTreeNode<TreeElement<Key, Value>>*)> fun;
        fun = [this, &fun](RBTreeNode<TreeElement<Key, Value>>* node) -> void {
            if (node == nullptr) {
                return;
            }
            _all_nodes.push_back(node);
            fun(node->left());
            fun(node->right());
        };
        fun(_root);
        return _all_nodes;
    }